

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.h
# Opt level: O3

void __thiscall nigel::Token::~Token(Token *this)

{
  ~Token(this);
  operator_delete(this,0x50);
  return;
}

Assistant:

virtual ~Token() {}